

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  lVar9 = *(long *)left->data;
  lVar2 = *(long *)((long)left->data + 8);
  lVar5 = *(long *)right->data;
  lVar3 = *(long *)((long)right->data + 8);
  lVar7 = (lVar5 >> 0x20) + lVar3 / 86400000000;
  lVar6 = lVar7 % 0x1e;
  lVar7 = (long)(int)lVar5 + lVar7 / 0x1e;
  lVar5 = (lVar9 >> 0x20) + lVar2 / 86400000000;
  lVar8 = lVar5 % 0x1e;
  lVar9 = (long)(int)lVar9 + lVar5 / 0x1e;
  if (lVar7 <= lVar9) {
    bVar4 = true;
    if (lVar7 < lVar9) goto LAB_00e4738a;
    if (lVar6 <= lVar8) {
      bVar4 = lVar3 % 86400000000 <= lVar2 % 86400000000 || lVar6 < lVar8;
      goto LAB_00e4738a;
    }
  }
  bVar4 = false;
LAB_00e4738a:
  *result->data = bVar4;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}